

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::AddAlgebraicConstraint
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,AlgConPrepare *pr)

{
  AlgConRange rr;
  AlgConRange rr_00;
  bool bVar1;
  long in_RSI;
  NodeRange NVar2;
  QuadTerms *in_stack_ffffffffffffefc8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *in_stack_ffffffffffffefd0;
  ExprType *in_stack_ffffffffffffefd8;
  QuadTerms *in_stack_ffffffffffffefe0;
  undefined1 uVar3;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *this_00;
  QuadAndLinTerms *in_stack_ffffffffffffefe8;
  LinTerms *lt;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *in_stack_ffffffffffffeff0;
  QuadAndLinTerms *this_01;
  double in_stack_ffffffffffffeff8;
  double in_stack_fffffffffffff000;
  type in_stack_fffffffffffff098;
  type in_stack_fffffffffffff0a0;
  type in_stack_fffffffffffff1d8;
  type in_stack_fffffffffffff1e0;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> local_c30;
  NodeRange local_888;
  AlgConRange local_878 [86];
  NodeRange local_310;
  NodeRange local_160;
  AlgConRange local_140 [19];
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = QuadTerms::empty((QuadTerms *)0x65e418);
  if (bVar1) {
    if (*(int *)(local_10 + 0x1d0) < 0) {
      LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffefd0,(LinTerms *)in_stack_ffffffffffffefc8
                        );
      uVar3 = (undefined1)((ulong)in_stack_ffffffffffffefe0 >> 0x38);
      AlgConRange::AlgConRange
                (local_140,*(double *)(local_10 + 0x1b8),*(double *)(local_10 + 0x1c0));
      rr.ub_ = in_stack_fffffffffffff000;
      rr.lb_ = in_stack_ffffffffffffeff8;
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
                ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_stack_ffffffffffffeff0,
                 &in_stack_ffffffffffffefe8->super_LinTerms,rr,(bool)uVar3);
      local_160 = ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                  ::AddConstraint_AS_ROOT<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                            ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                              *)in_stack_fffffffffffff0a0,
                             (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)
                             in_stack_fffffffffffff098);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::~AlgebraicConstraint
                ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)in_stack_ffffffffffffefd0);
      LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffefd0);
    }
    else {
      LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffefd0,(LinTerms *)in_stack_ffffffffffffefc8
                        );
      AlgebraicExpression<mp::LinTerms>::AlgebraicExpression
                ((AlgebraicExpression<mp::LinTerms> *)in_stack_ffffffffffffefe0,
                 (LinTerms *)in_stack_ffffffffffffefd8,(double)in_stack_ffffffffffffefd0);
      ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>::ComplementarityConstraint
                ((ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *)
                 in_stack_ffffffffffffefe0,(ExprType *)in_stack_ffffffffffffefd8,
                 (int)((ulong)in_stack_ffffffffffffefd0 >> 0x20));
      local_310 = ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                  ::
                  AddConstraint_AS_ROOT<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>>
                            ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                              *)in_stack_fffffffffffff0a0,
                             (ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *)
                             in_stack_fffffffffffff098);
      ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>::~ComplementarityConstraint
                ((ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *)
                 in_stack_ffffffffffffefd0);
      AlgebraicExpression<mp::LinTerms>::~AlgebraicExpression
                ((AlgebraicExpression<mp::LinTerms> *)0x65e5fb);
      LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffefd0);
    }
  }
  else if (*(int *)(local_10 + 0x1d0) < 0) {
    LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffefd0,(LinTerms *)in_stack_ffffffffffffefc8);
    QuadTerms::QuadTerms((QuadTerms *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
    QuadAndLinTerms::QuadAndLinTerms
              ((QuadAndLinTerms *)in_stack_ffffffffffffeff0,
               &in_stack_ffffffffffffefe8->super_LinTerms,in_stack_ffffffffffffefe0);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffefe0 >> 0x38);
    AlgConRange::AlgConRange(local_878,*(double *)(local_10 + 0x1b8),*(double *)(local_10 + 0x1c0));
    rr_00.ub_ = in_stack_fffffffffffff000;
    rr_00.lb_ = in_stack_ffffffffffffeff8;
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::AlgebraicConstraint
              (in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,rr_00,(bool)uVar3);
    local_888 = ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                ::
                AddConstraint_AS_ROOT<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>
                          ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                            *)in_stack_fffffffffffff1e0,
                           (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *)
                           in_stack_fffffffffffff1d8);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::~AlgebraicConstraint
              (in_stack_ffffffffffffefd0);
    QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_ffffffffffffefd0);
    QuadTerms::~QuadTerms((QuadTerms *)in_stack_ffffffffffffefd0);
    LinTerms::~LinTerms((LinTerms *)in_stack_ffffffffffffefd0);
  }
  else {
    lt = (LinTerms *)&stack0xfffffffffffff1a0;
    LinTerms::LinTerms((LinTerms *)in_stack_ffffffffffffefd0,(LinTerms *)in_stack_ffffffffffffefc8);
    this_01 = (QuadAndLinTerms *)&stack0xfffffffffffff060;
    QuadTerms::QuadTerms((QuadTerms *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
    QuadAndLinTerms::QuadAndLinTerms(this_01,lt,in_stack_ffffffffffffefe0);
    this_00 = &local_c30;
    AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
              ((AlgebraicExpression<mp::QuadAndLinTerms> *)this_00,
               &in_stack_ffffffffffffefd8->super_QuadAndLinTerms,(double)in_stack_ffffffffffffefd0);
    ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>::
    ComplementarityConstraint
              (this_00,in_stack_ffffffffffffefd8,(int)((ulong)in_stack_ffffffffffffefd0 >> 0x20));
    NVar2 = ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
            ::
            AddConstraint_AS_ROOT<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>>
                      ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        *)in_stack_fffffffffffff1e0,
                       (ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *)
                       in_stack_fffffffffffff1d8);
    ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>::
    ~ComplementarityConstraint
              ((ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *)NVar2.ir_
              );
    AlgebraicExpression<mp::QuadAndLinTerms>::~AlgebraicExpression
              ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x65e8ff);
    QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)NVar2.ir_);
    QuadTerms::~QuadTerms((QuadTerms *)NVar2.ir_);
    LinTerms::~LinTerms((LinTerms *)NVar2.ir_);
  }
  return;
}

Assistant:

void AddAlgebraicConstraint(AlgConPrepare&& pr) {
    if (pr.qt.empty()) {
      if (pr.compl_var<0)
        AddConstraint_AS_ROOT( LinConRange{ std::move(pr.lt),
                            { pr.lb, pr.ub }} );
      else
        AddConstraint_AS_ROOT(
              ComplementarityLinear{
                AffineExpr(std::move(pr.lt), pr.const_term), pr.compl_var } );
    } else {
      if (pr.compl_var<0)
        AddConstraint_AS_ROOT( QuadConRange{
                              { std::move(pr.lt), std::move(pr.qt) },
                              { pr.lb, pr.ub }} );
      else
        AddConstraint_AS_ROOT(
              ComplementarityQuadratic{
                QuadraticExpr
                { { std::move(pr.lt), std::move(pr.qt) }, pr.const_term },
                pr.compl_var } );
    }
  }